

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O3

Iterator __thiscall
Map<unsigned_int,_Error::Private::Str>::insert
          (Map<unsigned_int,_Error::Private::Str> *this,Item **cell,Item *parent,uint *key,
          Str *value)

{
  usize uVar1;
  Item *pIVar2;
  code *pcVar3;
  int iVar4;
  ItemBlock *pIVar5;
  char *__dest;
  Item *pIVar6;
  ulong __n;
  Iterator *pIVar7;
  long lVar8;
  Item *pIVar9;
  
  while ((cell == &parent->right || (cell == &parent->left || parent == (Item *)0x0) ||
         (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0x188,"!parent || cell == &parent->left || cell == &parent->right")
         , iVar4 == 0))) {
    pIVar9 = *cell;
    if (pIVar9 == (Item *)0x0) {
      pIVar9 = this->freeItem;
      if (pIVar9 == (Item *)0x0) {
        pIVar5 = (ItemBlock *)operator_new__(0x148);
        pIVar5->next = this->blocks;
        this->blocks = pIVar5;
        pIVar5[10].next = (ItemBlock *)0x0;
        pIVar5[0x14].next = pIVar5 + 1;
        pIVar5[0x1e].next = pIVar5 + 0xb;
        pIVar5[0x28].next = pIVar5 + 0x15;
        pIVar9 = (Item *)(pIVar5 + 0x1f);
        this->freeItem = pIVar9;
      }
      pIVar9->key = *key;
      uVar1 = value->_len;
      (pIVar9->value)._len = uVar1;
      __n = uVar1 + 1;
      __dest = (char *)operator_new__(__n);
      (pIVar9->value)._ptr = __dest;
      memcpy(__dest,value->_ptr,__n);
      pIVar9->parent = parent;
      pIVar9->left = (Item *)0x0;
      pIVar9->right = (Item *)0x0;
      pIVar9->height = 1;
      pIVar9->slope = 0;
      this->freeItem = pIVar9->prev;
      *cell = pIVar9;
      this->_size = this->_size + 1;
      if (parent != (Item *)0x0) {
        pIVar6 = parent;
        if (cell == &parent->right) {
          pIVar6 = parent->next;
        }
        pIVar2 = pIVar6->prev;
        pIVar7 = (Iterator *)&pIVar2->next;
        if (pIVar2 == (Item *)0x0) {
          pIVar7 = &this->_begin;
        }
        pIVar9->prev = pIVar2;
        pIVar7->item = pIVar9;
        pIVar9->next = pIVar6;
        pIVar6->prev = pIVar9;
        do {
          uVar1 = parent->height;
          Item::updateHeightAndSlope(parent);
          pIVar6 = rebal(this,parent);
          if (uVar1 == pIVar6->height) {
            return (Iterator)pIVar9;
          }
          parent = pIVar6->parent;
        } while (parent != (Item *)0x0);
        return (Iterator)pIVar9;
      }
      pIVar6 = (this->_begin).item;
      if (pIVar6 != &this->endItem) {
        iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x1a1,"_begin.item == &endItem");
        if (iVar4 != 0) break;
        pIVar6 = (this->_begin).item;
      }
      pIVar9->prev = (Item *)0x0;
      pIVar9->next = pIVar6;
      (this->_begin).item = pIVar9;
      (this->endItem).prev = pIVar9;
      return (Iterator)pIVar9;
    }
    lVar8 = 0x28;
    if ((*key <= pIVar9->key) && (lVar8 = 0x20, pIVar9->key <= *key)) {
      Error::Private::Str::operator=(&pIVar9->value,value);
      return (Iterator)pIVar9;
    }
    cell = (Item **)((long)&pIVar9->key + lVar8);
    parent = pIVar9;
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

Iterator insert(Item** cell, Item* parent, const T& key, const V& value)
  {
  begin:
    ASSERT(!parent || cell == &parent->left || cell == &parent->right);
    Item* position = *cell;
    if(!position)
    {
      Item* item = freeItem;
      if(!item)
      {
        ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
        itemBlock->next = blocks;
        blocks = itemBlock;
        for(Item* i = (Item*)(itemBlock + 1), * end = i + 4; i < end; ++i)
        {
          i->prev = item;
          item = i;
        }
        freeItem = item;
      }

      new(item) Item(parent, key, value);
      freeItem = item->prev;

      *cell = item;
      ++_size;
      if(!parent)
      { // first item
        ASSERT(_begin.item == &endItem);
        item->prev = 0;
        item->next = _begin.item;
        _begin.item = item;
        endItem.prev = item;
      }
      else
      {
        Item* insertPos = cell == &parent->right ? 
          parent->next : // insert after parent
          parent; // insert before parent
        if((item->prev = insertPos->prev))
          insertPos->prev->next = item;
        else
          _begin.item = item;
        item->next = insertPos;
        insertPos->prev = item;

        // neu:
        usize oldHeight;
        do
        {
          oldHeight = parent->height;
          parent->updateHeightAndSlope();
          parent = rebal(parent);
          if(oldHeight == parent->height)
            break;
          parent = parent->parent;
        } while(parent);
      }
      return item;
    }
    else
    {
      if(key > position->key)
      {
        cell = &position->right;
        parent = position;
        goto begin;
      }
      else if(key < position->key)
      {
        cell = &position->left;
        parent = position;
        goto begin;
      }
      else
      {
        position->value = value;
        return position;
      }
    }
  }